

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O0

void __thiscall SoftwareVersionTlv::SoftwareVersionTlv(SoftwareVersionTlv *this,istream *is)

{
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint8_t arr [4];
  istream *in_stack_fffffffffffffeb8;
  string *this_00;
  Tlv *in_stack_fffffffffffffec0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *this_01;
  string local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff0c;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [52];
  undefined1 local_14 [4];
  char *local_10;
  
  local_10 = in_RSI;
  Tlv::Tlv(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *(undefined ***)in_RDI = &PTR__SoftwareVersionTlv_0017d118;
  this_01 = &in_RDI->field_2;
  std::__cxx11::string::string((string *)this_01->_M_local_buf);
  std::__cxx11::string::string((string *)in_RDI[1].field_2._M_local_buf);
  std::istream::read(local_10,(long)local_14);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_RDI,this_01->_M_local_buf);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  this_00 = local_48;
  std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_RDI,this_01->_M_local_buf);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::operator=((string *)in_RDI[1].field_2._M_local_buf,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  return;
}

Assistant:

SoftwareVersionTlv::SoftwareVersionTlv(std::istream& is) : Tlv(is)
{
    uint8_t arr[4];
    is.read((char*)&arr, 4);
    release_version = std::to_string(arr[0]) + "." + std::to_string(arr[1]);
    tlv_version     = std::to_string(arr[2]) + "." + std::to_string(arr[3]);
}